

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O2

bool __thiscall trivialre::MatchSubstring(trivialre *this,Matcher *m,string_view str)

{
  bool bVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> __args;
  undefined1 auStack_48 [8];
  CB succeed;
  
  pcVar2 = (char *)str._M_len;
  auStack_48 = (undefined1  [8])0x0;
  succeed.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  succeed.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:59:16)>
       ::_M_invoke;
  succeed.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:59:16)>
       ::_M_manager;
  bVar1 = true;
  do {
    if (m == (Matcher *)0x0) {
      bVar1 = std::
              function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
              ::operator()((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                            *)this,(basic_string_view<char,_std::char_traits<char>_>)
                                   (ZEXT816(0x133bb8) << 0x40),bVar1,
                           (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                            *)auStack_48);
LAB_0010c27c:
      std::_Function_base::~_Function_base((_Function_base *)auStack_48);
      return bVar1;
    }
    __args._M_str = pcVar2;
    __args._M_len = (size_t)m;
    bVar1 = std::
            function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
            ::operator()((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                          *)this,__args,bVar1,
                         (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                          *)auStack_48);
    if (bVar1) {
      bVar1 = true;
      goto LAB_0010c27c;
    }
    bVar1 = *pcVar2 == '\n';
    pcVar2 = pcVar2 + 1;
    m = (Matcher *)((long)&m[-1]._M_invoker + 7);
  } while( true );
}

Assistant:

inline bool MatchSubstring(const Matcher& m, std::string_view str) {
  size_t sz = str.size();
  CB succeed = [](std::string_view str, bool line_start) { return true; };
  bool line_start = true;
  for (size_t i = 0; i < sz; i++) {
    if (m(str, line_start, succeed)) {
      return true;
    }
    line_start = (str[0] == '\n');
    str.remove_prefix(1);
  }
  return m("", line_start, succeed);
}